

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb_SplitNodeConforming_Quad(leb_Heap *leb,leb_Node node)

{
  int32_t iVar1;
  leb_Node node_00;
  
  if (leb->maxDepth != node.depth) {
    iVar1 = leb->minDepth;
    while( true ) {
      leb__SplitNode(leb,node);
      node_00 = leb__EdgeNode_Quad(node);
      if (node_00.id >> ((byte)iVar1 & 0x1f) == 0) break;
      leb__SplitNode(leb,node_00);
      node = leb_ParentNode(node_00);
    }
  }
  return;
}

Assistant:

LEBDEF void leb_SplitNodeConforming_Quad(leb_Heap *leb, const leb_Node node)
{
    if (!leb_IsCeilNode(leb, node)) {
        const uint32_t minNodeID = 1u << leb->minDepth;
        leb_Node nodeIterator = node;

        leb__SplitNode(leb, nodeIterator);
        nodeIterator = leb__EdgeNode_Quad(nodeIterator);

        while (nodeIterator.id >= minNodeID) {
            leb__SplitNode(leb, nodeIterator);
            nodeIterator = leb_ParentNode(nodeIterator);
            leb__SplitNode(leb, nodeIterator);
            nodeIterator = leb__EdgeNode_Quad(nodeIterator);
        }
    }
}